

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

bool __thiscall
cmLocalGenerator::GetRealDependency
          (cmLocalGenerator *this,string *inName,string *config,string *dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  TargetType TVar7;
  cmGeneratorTarget *this_00;
  char *pcVar8;
  char *__s;
  cmSourceFile *this_01;
  string tLocation;
  string depLocation;
  string name;
  undefined1 local_c0 [40];
  string local_98;
  string *local_78;
  string local_70;
  string local_50;
  
  local_78 = config;
  cmsys::SystemTools::GetFilenameName(&local_50,inName);
  if (local_50._M_string_length == 0) {
LAB_002e5756:
    bVar5 = false;
  }
  else {
    cmsys::SystemTools::GetFilenameLastExtension((string *)local_c0,&local_50);
    iVar6 = std::__cxx11::string::compare(local_c0);
    pcVar2 = local_c0 + 0x10;
    if ((pointer)local_c0._0_8_ != pcVar2) {
      operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
    }
    if (iVar6 == 0) {
      cmsys::SystemTools::GetFilenameWithoutLastExtension((string *)local_c0,&local_50);
      std::__cxx11::string::operator=((string *)&local_50,(string *)local_c0);
      if ((pointer)local_c0._0_8_ != pcVar2) {
        operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
      }
    }
    this_00 = FindGeneratorTargetToUse(this,&local_50);
    if (this_00 != (cmGeneratorTarget *)0x0) {
      bVar5 = cmsys::SystemTools::FileIsFullPath(inName);
      if (bVar5) {
        local_c0._8_8_ = (char *)0x0;
        local_c0[0x10] = '\0';
        local_c0._0_8_ = pcVar2;
        TVar7 = cmGeneratorTarget::GetType(this_00);
        if (-1 < (int)TVar7) {
          TVar7 = cmGeneratorTarget::GetType(this_00);
          if ((int)TVar7 < 4) {
            pcVar8 = cmGeneratorTarget::GetLocation(this_00,local_78);
            uVar3 = local_c0._8_8_;
            strlen(pcVar8);
            std::__cxx11::string::_M_replace((ulong)local_c0,0,(char *)uVar3,(ulong)pcVar8);
            cmsys::SystemTools::GetFilenamePath(&local_98,(string *)local_c0);
            std::__cxx11::string::operator=((string *)local_c0,(string *)&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            cmsys::SystemTools::CollapseFullPath(&local_98,(string *)local_c0);
            std::__cxx11::string::operator=((string *)local_c0,(string *)&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
          }
        }
        paVar1 = &local_70.field_2;
        pcVar2 = (inName->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,pcVar2 + inName->_M_string_length);
        cmsys::SystemTools::GetFilenamePath(&local_98,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        cmsys::SystemTools::CollapseFullPath(&local_70,&local_98);
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != paVar1) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        _Var4._M_p = local_98._M_dataplus._M_p;
        if (local_98._M_string_length != local_c0._8_8_) {
LAB_002e5692:
          std::__cxx11::string::_M_assign((string *)dep);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
            operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
          }
          bVar5 = true;
          goto LAB_002e57ed;
        }
        if ((char *)local_98._M_string_length != (char *)0x0) {
          iVar6 = bcmp(local_98._M_dataplus._M_p,(void *)local_c0._0_8_,local_98._M_string_length);
          if (iVar6 != 0) goto LAB_002e5692;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var4._M_p != &local_98.field_2) {
          operator_delete(_Var4._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
          operator_delete((void *)local_c0._0_8_,CONCAT71(local_c0._17_7_,local_c0[0x10]) + 1);
        }
      }
      TVar7 = cmGeneratorTarget::GetType(this_00);
      if (TVar7 < (UNKNOWN_LIBRARY|STATIC_LIBRARY)) {
        if ((0x10fU >> (TVar7 & 0x1f) & 1) != 0) {
          __s = cmGeneratorTarget::GetLocation(this_00,local_78);
          pcVar8 = (char *)dep->_M_string_length;
          strlen(__s);
          bVar5 = true;
          std::__cxx11::string::_M_replace((ulong)dep,0,pcVar8,(ulong)__s);
          goto LAB_002e57ed;
        }
        goto LAB_002e5756;
      }
    }
    bVar5 = cmsys::SystemTools::FileIsFullPath(inName);
    if (bVar5) {
      bVar5 = true;
      std::__cxx11::string::_M_assign((string *)dep);
    }
    else {
      this_01 = cmMakefile::GetSource(this->Makefile,inName,Ambiguous);
      if (this_01 == (cmSourceFile *)0x0) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_c0,&this->StateSnapshot);
        cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_c0);
        std::__cxx11::string::_M_assign((string *)dep);
        std::__cxx11::string::append((char *)dep);
        bVar5 = true;
        std::__cxx11::string::_M_append((char *)dep,(ulong)(inName->_M_dataplus)._M_p);
      }
      else {
        cmSourceFile::GetFullPath(this_01,(string *)0x0);
        bVar5 = true;
        std::__cxx11::string::_M_assign((string *)dep);
      }
    }
  }
LAB_002e57ed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool cmLocalGenerator::GetRealDependency(const std::string& inName,
                                         const std::string& config,
                                         std::string& dep)
{
  // Older CMake code may specify the dependency using the target
  // output file rather than the target name.  Such code would have
  // been written before there was support for target properties that
  // modify the name so stripping down to just the file name should
  // produce the target name in this case.
  std::string name = cmSystemTools::GetFilenameName(inName);

  // If the input name is the empty string, there is no real
  // dependency. Short-circuit the other checks:
  if (name.empty()) {
    return false;
  }

  if (cmSystemTools::GetFilenameLastExtension(name) == ".exe") {
    name = cmSystemTools::GetFilenameWithoutLastExtension(name);
  }

  // Look for a CMake target with the given name.
  if (cmGeneratorTarget* target = this->FindGeneratorTargetToUse(name)) {
    // make sure it is not just a coincidence that the target name
    // found is part of the inName
    if (cmSystemTools::FileIsFullPath(inName)) {
      std::string tLocation;
      if (target->GetType() >= cmStateEnums::EXECUTABLE &&
          target->GetType() <= cmStateEnums::MODULE_LIBRARY) {
        tLocation = target->GetLocation(config);
        tLocation = cmSystemTools::GetFilenamePath(tLocation);
        tLocation = cmSystemTools::CollapseFullPath(tLocation);
      }
      std::string depLocation =
        cmSystemTools::GetFilenamePath(std::string(inName));
      depLocation = cmSystemTools::CollapseFullPath(depLocation);
      if (depLocation != tLocation) {
        // it is a full path to a depend that has the same name
        // as a target but is in a different location so do not use
        // the target as the depend
        dep = inName;
        return true;
      }
    }
    switch (target->GetType()) {
      case cmStateEnums::EXECUTABLE:
      case cmStateEnums::STATIC_LIBRARY:
      case cmStateEnums::SHARED_LIBRARY:
      case cmStateEnums::MODULE_LIBRARY:
      case cmStateEnums::UNKNOWN_LIBRARY:
        dep = target->GetLocation(config);
        return true;
      case cmStateEnums::OBJECT_LIBRARY:
        // An object library has no single file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::INTERFACE_LIBRARY:
        // An interface library has no file on which to depend.
        // This was listed to get the target-level dependency.
        return false;
      case cmStateEnums::UTILITY:
      case cmStateEnums::GLOBAL_TARGET:
        // A utility target has no file on which to depend.  This was listed
        // only to get the target-level dependency.
        return false;
    }
  }

  // The name was not that of a CMake target.  It must name a file.
  if (cmSystemTools::FileIsFullPath(inName)) {
    // This is a full path.  Return it as given.
    dep = inName;
    return true;
  }

  // Check for a source file in this directory that matches the
  // dependency.
  if (cmSourceFile* sf = this->Makefile->GetSource(inName)) {
    dep = sf->GetFullPath();
    return true;
  }

  // Treat the name as relative to the source directory in which it
  // was given.
  dep = this->StateSnapshot.GetDirectory().GetCurrentSource();
  dep += "/";
  dep += inName;
  return true;
}